

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acquisition.c
# Opt level: O0

int katherine_acquisition_init
              (katherine_acquisition_t *acq,katherine_device_t *device,void *ctx,
              size_t md_buffer_size,size_t pixel_buffer_size,int report_timeout,int fail_timeout)

{
  char *pcVar1;
  size_t actual_md_buffer_size;
  int res;
  int report_timeout_local;
  size_t pixel_buffer_size_local;
  size_t md_buffer_size_local;
  void *ctx_local;
  katherine_device_t *device_local;
  katherine_acquisition_t *acq_local;
  
  acq->device = device;
  acq->user_ctx = ctx;
  acq->state = '\0';
  acq->aborted = false;
  acq->md_buffer_size = md_buffer_size;
  pcVar1 = (char *)malloc(acq->md_buffer_size + 7 & 0xfffffffffffffff8);
  acq->md_buffer = pcVar1;
  if (acq->md_buffer != (char *)0x0) {
    acq->pixel_buffer_size = pixel_buffer_size;
    pcVar1 = (char *)malloc(acq->pixel_buffer_size);
    acq->pixel_buffer = pcVar1;
    acq->pixel_buffer_valid = 0;
    if (acq->pixel_buffer != (char *)0x0) {
      acq->report_timeout = report_timeout;
      acq->fail_timeout = fail_timeout;
      return 0;
    }
    free(acq->md_buffer);
  }
  return 0xc;
}

Assistant:

int
katherine_acquisition_init(katherine_acquisition_t *acq, katherine_device_t *device, void *ctx, size_t md_buffer_size, size_t pixel_buffer_size, int report_timeout, int fail_timeout)
{
    int res = 0;

    acq->device = device;
    acq->user_ctx = ctx;
    acq->state = ACQUISITION_NOT_STARTED;
    acq->aborted = false;

    acq->md_buffer_size = md_buffer_size;

    // Round MD buffer size up to the nearest multiple of 8 bytes.
    // This is just a safety precaution due to accessing 6-byte MD's as uint64_t's.
    size_t actual_md_buffer_size = ((acq->md_buffer_size + 7) / 8) * 8;
    acq->md_buffer = (char *) malloc(actual_md_buffer_size);
    if (acq->md_buffer == NULL) {
        res = ENOMEM;
        goto err_datagram_buffer;
    }

    acq->pixel_buffer_size = pixel_buffer_size;
    acq->pixel_buffer = (char *) malloc(acq->pixel_buffer_size);
    acq->pixel_buffer_valid = 0;
    if (acq->pixel_buffer == NULL) {
        res = ENOMEM;
        goto err_pixel_buffer;
    }

    acq->report_timeout = report_timeout;
    acq->fail_timeout = fail_timeout;

    return res;

err_pixel_buffer:
    free(acq->md_buffer);
err_datagram_buffer:
    return res;
}